

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O2

void __thiscall BRTS_XZ<UFPC>::SecondScan(BRTS_XZ<UFPC> *this)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  Mat1b *pMVar5;
  Mat1i *pMVar6;
  uint *puVar7;
  Run *pRVar8;
  ulong uVar9;
  ulong uVar10;
  Run *pRVar11;
  long lVar12;
  long lVar13;
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar3 = *(int *)&pMVar5->field_0xc;
  uVar4 = *(uint *)&pMVar5->field_0x8;
  pRVar11 = (this->data_runs).runs;
  uVar10 = 0;
  uVar9 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar9 = uVar10;
  }
  for (; puVar7 = UFPC::P_, uVar10 != uVar9; uVar10 = uVar10 + 1) {
    lVar12 = **(long **)&pMVar6->field_0x48 * uVar10 + *(long *)&pMVar6->field_0x10;
    lVar13 = 0;
    pRVar8 = pRVar11;
    do {
      pRVar11 = pRVar8;
      uVar1 = pRVar11->start_pos;
      lVar13 = (long)(int)lVar13;
      if ((ulong)uVar1 == 0xffff) {
        for (; lVar13 < iVar3; lVar13 = lVar13 + 1) {
          *(undefined4 *)(lVar12 + lVar13 * 4) = 0;
        }
        pRVar11 = pRVar11 + 1;
      }
      else {
        uVar2 = pRVar11->end_pos;
        uVar4 = puVar7[pRVar11->label];
        for (; lVar13 < (long)(ulong)uVar1; lVar13 = lVar13 + 1) {
          *(undefined4 *)(lVar12 + lVar13 * 4) = 0;
        }
        for (; lVar13 < (long)(ulong)uVar2; lVar13 = lVar13 + 1) {
          *(uint *)(lVar12 + lVar13 * 4) = uVar4;
        }
      }
      pRVar8 = pRVar11 + 1;
    } while (uVar1 != 0xffff);
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) labels[j] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (; j < end_pos; j++) labels[j] = label;
            }
        }
    }